

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

void cmime_message_prepend_subject(CMimeMessage_T *message,char *s)

{
  char *local_28;
  char *new_subject;
  char *orig_subject;
  char *s_local;
  CMimeMessage_T *message_local;
  
  new_subject = (char *)0x0;
  local_28 = (char *)0x0;
  orig_subject = s;
  s_local = (char *)message;
  new_subject = cmime_message_get_subject(message);
  asprintf(&local_28,"%s %s",orig_subject,new_subject);
  cmime_message_set_subject((CMimeMessage_T *)s_local,local_28);
  if (local_28 != (char *)0x0) {
    free(local_28);
  }
  return;
}

Assistant:

void cmime_message_prepend_subject(CMimeMessage_T *message, const char *s) {
    char *orig_subject = NULL;
    char *new_subject = NULL;

    orig_subject = cmime_message_get_subject(message);
    asprintf(&new_subject, "%s %s", s, orig_subject);
    cmime_message_set_subject(message, new_subject);
    if(new_subject != NULL)
        free(new_subject);
}